

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntSelectSort(int *pArray,int nSize)

{
  int iVar1;
  int local_24;
  int local_20;
  int best_i;
  int j;
  int i;
  int temp;
  int nSize_local;
  int *pArray_local;
  
  for (best_i = 0; best_i < nSize + -1; best_i = best_i + 1) {
    local_24 = best_i;
    local_20 = best_i;
    while (local_20 = local_20 + 1, local_20 < nSize) {
      if (pArray[local_20] < pArray[local_24]) {
        local_24 = local_20;
      }
    }
    iVar1 = pArray[best_i];
    pArray[best_i] = pArray[local_24];
    pArray[local_24] = iVar1;
  }
  return;
}

Assistant:

static inline void Vec_IntSelectSort( int * pArray, int nSize )
{
    int temp, i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( pArray[j] < pArray[best_i] )
                best_i = j;
        temp = pArray[i]; 
        pArray[i] = pArray[best_i]; 
        pArray[best_i] = temp;
    }
}